

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.cc
# Opt level: O2

int __thiscall mp::BinaryFormatter::apr(BinaryFormatter *this,File *f,char *fmt,...)

{
  char cVar1;
  NLUtils *pNVar2;
  char *pcVar3;
  char in_AL;
  int iVar4;
  int iVar5;
  U *pUVar6;
  undefined2 *puVar7;
  undefined4 *puVar8;
  undefined1 *puVar9;
  undefined8 *puVar10;
  size_t sVar11;
  undefined8 in_RCX;
  ulong uVar12;
  char *__s;
  undefined8 in_R8;
  undefined8 in_R9;
  FILE *__stream;
  char *pcVar13;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  size_t sStack_170;
  va_list ap;
  U u;
  allocator<char> local_141;
  BinaryFormatter *local_140;
  FILE *local_138;
  size_t local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  U local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  __stream = (FILE *)f->f_;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x18;
  ap[0].fp_offset = 0x30;
  cVar1 = *fmt;
  iVar4 = 0;
  local_e8[3] = (U)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((cVar1 != 0x25) && (fmt = fmt + 1, cVar1 != 'i')) {
    u.c = cVar1;
    fputc((int)cVar1,__stream);
    iVar4 = 1;
  }
  do {
    iVar5 = iVar4;
    sStack_170 = 4;
    do {
      pcVar3 = fmt;
      __s = pcVar3 + 1;
      fmt = __s;
    } while (*pcVar3 == ' ');
    if (*pcVar3 != '%') {
      return iVar5;
    }
    fmt = pcVar3 + 2;
    cVar1 = *__s;
    pcVar13 = fmt;
    switch(cVar1) {
    case 'c':
      uVar12 = ap[0]._0_8_ & 0xffffffff;
      if (uVar12 < 0x29) {
        ap[0].gp_offset = ap[0].gp_offset + 8;
        puVar9 = (undefined1 *)((long)local_e8 + uVar12);
      }
      else {
        puVar9 = (undefined1 *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      u.c = *puVar9;
      sStack_170 = 1;
      break;
    case 'd':
switchD_0010bf1d_caseD_64:
      uVar12 = ap[0]._0_8_ & 0xffffffff;
      if (uVar12 < 0x29) {
        ap[0].gp_offset = ap[0].gp_offset + 8;
        puVar8 = (undefined4 *)((long)local_e8 + uVar12);
      }
      else {
        puVar8 = (undefined4 *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      u.L = *puVar8;
      break;
    case 'e':
    case 'f':
    case 'i':
    case 'j':
    case 'k':
switchD_0010bf1d_caseD_65:
      pNVar2 = this->utils_;
      local_138 = __stream;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,__s,&local_141);
      std::operator+(&local_108,"bprintf bug: unexpected fmt: ",&local_128);
      (*pNVar2->_vptr_NLUtils[7])(pNVar2,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      sStack_170 = local_130;
      __stream = local_138;
      break;
    case 'g':
switchD_0010bf1d_caseD_67:
      uVar12 = (ulong)ap[0].fp_offset;
      if (uVar12 < 0xa1) {
        ap[0].fp_offset = ap[0].fp_offset + 0x10;
        pUVar6 = (U *)((long)local_e8 + uVar12);
      }
      else {
        pUVar6 = (U *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      u = *pUVar6;
      sStack_170 = 8;
      fmt = pcVar13;
      break;
    case 'h':
      uVar12 = ap[0]._0_8_ & 0xffffffff;
      if (uVar12 < 0x29) {
        ap[0].gp_offset = ap[0].gp_offset + 8;
        puVar7 = (undefined2 *)((long)local_e8 + uVar12);
      }
      else {
        puVar7 = (undefined2 *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      u.sh = *puVar7;
      if (pcVar3[2] == 'd') {
        fmt = pcVar3 + 3;
      }
      sStack_170 = 2;
      break;
    case 'l':
      uVar12 = ap[0]._0_8_ & 0xffffffff;
      if (uVar12 < 0x29) {
        ap[0].gp_offset = ap[0].gp_offset + 8;
        puVar8 = (undefined4 *)((long)local_e8 + uVar12);
      }
      else {
        puVar8 = (undefined4 *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      u.L = *puVar8;
      if (pcVar3[2] == 'd') {
        fmt = pcVar3 + 3;
      }
      break;
    default:
      if (cVar1 == '.') {
        do {
          pcVar13 = fmt + 1;
          cVar1 = *fmt;
          fmt = pcVar13;
        } while (cVar1 != 'g');
        goto switchD_0010bf1d_caseD_67;
      }
      if (cVar1 != 's') {
        if (cVar1 != 'z') goto switchD_0010bf1d_caseD_65;
        goto switchD_0010bf1d_caseD_64;
      }
      uVar12 = ap[0]._0_8_ & 0xffffffff;
      if (uVar12 < 0x29) {
        ap[0].gp_offset = ap[0].gp_offset + 8;
        puVar10 = (undefined8 *)((long)local_e8 + uVar12);
      }
      else {
        puVar10 = (undefined8 *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      pcVar3 = (char *)*puVar10;
      local_140 = this;
      sVar11 = strlen(pcVar3);
      u.L = (int)sVar11;
      fwrite(&u,4,1,__stream);
      fwrite(pcVar3,(long)u.L,1,__stream);
      this = local_140;
      goto LAB_0010c11e;
    }
    local_130 = sStack_170;
    fwrite(&u,sStack_170,1,__stream);
LAB_0010c11e:
    iVar4 = iVar5 + 1;
    if (*fmt == ':') {
      uVar12 = ap[0]._0_8_ & 0xffffffff;
      if (uVar12 < 0x29) {
        ap[0].gp_offset = ap[0].gp_offset + 8;
        puVar10 = (undefined8 *)((long)local_e8 + uVar12);
      }
      else {
        puVar10 = (undefined8 *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      fwrite((void *)*puVar10,(long)u.L,1,__stream);
      fmt = fmt + 3;
      iVar4 = iVar5 + 2;
    }
  } while( true );
}

Assistant:

int BinaryFormatter::
apr(File& f, const char *fmt, ...)
{
  auto fd = f.GetHandle();
  U u;
  char *s;
  int i, rc;
  size_t len, x;
  va_list ap;

  rc = 0;
  va_start(ap, fmt);

  if ((i = *fmt) != '%') {
    fmt++;
#define DMG
#ifdef DMG
    if (i != 'i')
#endif
    {
      u.c = i;
      fwrite(&u.c, 1, 1, fd);
      rc++;
    }}

  for(;;) {
    while(*fmt == ' ')
      fmt++;
    if (*fmt++ != '%')
      break;
    switch(*fmt++) {
    case 'c':
      u.c = va_arg(ap, int);
      len = 1;
      break;
    case 'd':
      u.i = va_arg(ap, int);
      len = sizeof(Int);
      break;
    case '.':
      while(*fmt++ != 'g');
    case 'g':
      u.x = va_arg(ap, double);
      len = sizeof(double);
      break;
    case 'h':
      u.sh = va_arg(ap, int);
      len = sizeof(short);
      if (*fmt == 'd')
        fmt++;
      break;
    case 'l':
      u.L = (Long)va_arg(ap, long);
      len = sizeof(Long);
      if (*fmt == 'd')
        fmt++;
      break;
    case 's':
      s = va_arg(ap, char*);
      u.i = std::strlen(s);
      fwrite((char *)&u.i, sizeof(Int), 1, fd);
      fwrite(s, u.i, 1, fd);
      goto s_written;
    case 'z':
      x = va_arg(ap, size_t);
      u.L = (Long)x;
      len = sizeof(Long);
      break;
    default:
      Utils().myexit("bprintf bug: unexpected fmt: " +
                     std::string(fmt-1));
#ifdef AVOID_BOGUS_WARNINGS
      len = 0;
#endif
    }
    fwrite((char *)&u.L, len, 1, fd);
s_written:
    rc++;
    if (*fmt == ':') {
      /* special Hollerith */
      s = va_arg(ap, char*);
      fwrite(s, u.i, 1, fd);
      fmt += 3;
      rc++;
    }
  }
  va_end(ap);
  return rc;
}